

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_long>::test_small_numerators<(libdivide::Branching)1>
          (DivideTest<unsigned_long> *this,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)1> *the_divider)

{
  int32_t i;
  int32_t small_stop;
  divider<unsigned_long,_(libdivide::Branching)1> *in_stack_00000030;
  unsigned_long in_stack_00000038;
  unsigned_long in_stack_00000040;
  DivideTest<unsigned_long> *in_stack_00000048;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < 0x10000; local_20 = local_20 + 1) {
    test_one<(libdivide::Branching)1>
              (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  return;
}

Assistant:

void test_small_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test small numerators < 2^16
        // balance signed & unsigned testing
#if defined(__AVR__)
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 7 : (uint32_t)1 << 8;
#else
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 14 : (uint32_t)1 << 16;
#endif
        for (int32_t i = 0; i < small_stop; ++i) {
            test_one((T)i, denom, the_divider);

            if (limits::is_signed) {
                test_one((T)-i, denom, the_divider);
            }
        }
    }